

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

string * __thiscall cmCTestBZR::LoadInfo_abi_cxx11_(string *__return_storage_ptr__,cmCTestBZR *this)

{
  pointer pcVar1;
  char *bzr_revno [3];
  char *bzr_info [3];
  OutputLogger rerr;
  OutputLogger ierr;
  RevnoParser rout;
  InfoParser iout;
  
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  bzr_info[1] = "info";
  bzr_info[2] = (char *)0x0;
  bzr_info[0] = pcVar1;
  InfoParser::InfoParser(&iout,this,"info-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&ierr,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"info-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,bzr_info,(OutputParser *)&iout,(OutputParser *)&ierr,
                      (char *)0x0,Auto);
  bzr_revno[1] = "revno";
  bzr_revno[2] = (char *)0x0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bzr_revno[0] = pcVar1;
  RevnoParser::RevnoParser(&rout,this,"revno-out> ",__return_storage_ptr__);
  cmProcessTools::OutputLogger::OutputLogger
            (&rerr,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"revno-err> ");
  cmCTestVC::RunChild((cmCTestVC *)this,bzr_revno,(OutputParser *)&rout,(OutputParser *)&rerr,
                      (char *)0x0,Auto);
  cmProcessTools::LineParser::~LineParser(&rerr.super_LineParser);
  RevnoParser::~RevnoParser(&rout);
  cmProcessTools::LineParser::~LineParser(&ierr.super_LineParser);
  InfoParser::~InfoParser(&iout);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestBZR::LoadInfo()
{
  // Run "bzr info" to get the repository info from the work tree.
  const char* bzr = this->CommandLineTool.c_str();
  const char* bzr_info[] = { bzr, "info", nullptr };
  InfoParser iout(this, "info-out> ");
  OutputLogger ierr(this->Log, "info-err> ");
  this->RunChild(bzr_info, &iout, &ierr);

  // Run "bzr revno" to get the repository revision number from the work tree.
  const char* bzr_revno[] = { bzr, "revno", nullptr };
  std::string rev;
  RevnoParser rout(this, "revno-out> ", rev);
  OutputLogger rerr(this->Log, "revno-err> ");
  this->RunChild(bzr_revno, &rout, &rerr);

  return rev;
}